

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

bool __thiscall
irr::video::CNullDriver::setRenderTarget
          (CNullDriver *this,ITexture *texture,u16 clearFlag,SColor clearColor,f32 clearDepth,
          u8 clearStencil)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppIVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  undefined7 in_register_00000081;
  ulong uVar8;
  undefined1 auVar9 [16];
  ITexture *local_58;
  string<char> local_50;
  IRenderTarget *pIVar4;
  
  uVar8 = CONCAT71(in_register_00000081,clearStencil);
  if (texture == (ITexture *)0x0) {
    iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x27])
                      (this,0,clearFlag,(ulong)clearColor.color,clearStencil);
    return SUB41(iVar3,0);
  }
  pIVar4 = this->SharedRenderTarget;
  if (pIVar4 == (IRenderTarget *)0x0) {
    iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x22])(this);
    pIVar4 = (IRenderTarget *)CONCAT44(extraout_var,iVar3);
    this->SharedRenderTarget = pIVar4;
  }
  ppIVar2 = (this->SharedDepthTextures).m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(this->SharedDepthTextures).m_data.
                        super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3;
  if ((int)uVar5 != 0) {
    uVar6 = 0;
    do {
      local_58 = ppIVar2[uVar6];
      auVar9._0_4_ = -(uint)((local_58->Size).Width == (texture->Size).Width);
      iVar3 = -(uint)((local_58->Size).Height == (texture->Size).Height);
      auVar9._4_4_ = auVar9._0_4_;
      auVar9._8_4_ = iVar3;
      auVar9._12_4_ = iVar3;
      uVar7 = movmskpd((int)uVar8,auVar9);
      uVar8 = (ulong)uVar7;
      if (uVar7 == 3) goto LAB_001ca814;
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0xffffffff) != uVar6);
  }
  paVar1 = &local_50.str.field_2;
  local_50.str._M_string_length = 0;
  local_50.str.field_2._M_local_buf[0] = '\0';
  local_50.str._M_dataplus._M_p = (pointer)paVar1;
  core::string<char>::operator=(&local_50,"IRR_DEPTH_STENCIL");
  iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x14])(this,&texture->Size,&local_50,0x10)
  ;
  local_58 = (ITexture *)CONCAT44(extraout_var_00,iVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.str._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.str._M_dataplus._M_p,
                    CONCAT71(local_50.str.field_2._M_allocated_capacity._1_7_,
                             local_50.str.field_2._M_local_buf[0]) + 1);
  }
  core::array<irr::video::ITexture_*>::push_back(&this->SharedDepthTextures,&local_58);
  pIVar4 = this->SharedRenderTarget;
LAB_001ca814:
  local_50.str._M_dataplus._M_p = (pointer)texture;
  (**pIVar4->_vptr_IRenderTarget)(pIVar4,&local_50,1,local_58,0,0);
  iVar3 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x27])
                    (this,this->SharedRenderTarget,clearFlag,(ulong)clearColor.color,clearStencil);
  return SUB41(iVar3,0);
}

Assistant:

bool CNullDriver::setRenderTarget(ITexture *texture, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (texture) {
		// create render target if require.
		if (!SharedRenderTarget)
			SharedRenderTarget = addRenderTarget();

		ITexture *depthTexture = 0;

		// try to find available depth texture with require size.
		for (u32 i = 0; i < SharedDepthTextures.size(); ++i) {
			if (SharedDepthTextures[i]->getSize() == texture->getSize()) {
				depthTexture = SharedDepthTextures[i];

				break;
			}
		}

		// create depth texture if require.
		if (!depthTexture) {
			depthTexture = addRenderTargetTexture(texture->getSize(), "IRR_DEPTH_STENCIL", video::ECF_D24S8);
			SharedDepthTextures.push_back(depthTexture);
		}

		SharedRenderTarget->setTexture(texture, depthTexture);

		return setRenderTargetEx(SharedRenderTarget, clearFlag, clearColor, clearDepth, clearStencil);
	} else {
		return setRenderTargetEx(0, clearFlag, clearColor, clearDepth, clearStencil);
	}
}